

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O1

int run_helper_pipe_echo_server(void)

{
  int iVar1;
  uv_fs_t req;
  uv_fs_t local_1c0;
  
  loop = uv_default_loop();
  uv_fs_unlink((uv_loop_t *)0x0,&local_1c0,"/tmp/uv-test-sock",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&local_1c0);
  server = (uv_handle_t *)&pipeServer;
  serverType = PIPE;
  iVar1 = uv_pipe_init(loop,&pipeServer,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&pipeServer,0x1000,on_connection);
      if (iVar1 == 0) {
        notify_parent_process();
        uv_run(loop,UV_RUN_DEFAULT);
        return 0;
      }
      run_helper_pipe_echo_server_cold_3();
    }
    else {
      run_helper_pipe_echo_server_cold_2();
    }
  }
  else {
    run_helper_pipe_echo_server_cold_1();
  }
  return 1;
}

Assistant:

HELPER_IMPL(pipe_echo_server) {
  loop = uv_default_loop();

  if (pipe_echo_start(TEST_PIPENAME))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}